

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

void * c4::aalloc(size_t sz,size_t alignment)

{
  void *pvVar1;
  
  if (detail::s_aalloc == (undefined *)0x0) {
    aalloc();
  }
  pvVar1 = (void *)(*(code *)detail::s_aalloc)(sz,alignment);
  return pvVar1;
}

Assistant:

void* aalloc(size_t sz, size_t alignment)
{
    C4_ASSERT_MSG(c4::get_aalloc() != nullptr, "did you forget to call set_aalloc()?");
    auto fn = c4::get_aalloc();
    void* ptr = fn(sz, alignment);
    return ptr;
}